

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O3

void decompressBlockTHUMB59TAlphaC
               (uint block_part1,uint block_part2,uint8 *img,uint8 *alpha,int width,int height,
               int startx,int starty,int channelsRGB)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  uint8 *puVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  byte local_4c [6];
  byte local_46;
  byte local_45;
  undefined1 local_44;
  undefined1 local_43;
  undefined1 local_42;
  undefined1 local_41;
  int local_40;
  int local_3c;
  long local_38;
  uint8 paint_colors [4] [3];
  
  puVar9 = img + 3;
  if (channelsRGB == 3) {
    puVar9 = alpha;
  }
  uVar7 = block_part1 >> 0xb & 0xf;
  uVar11 = block_part1 >> 7 & 0xf;
  uVar3 = block_part1 >> 3 & 0xf;
  uVar16 = (block_part1 >> 0xb) << 4;
  uVar10 = (block_part1 >> 7) << 4;
  uVar3 = uVar3 << 4 | uVar3;
  bVar1 = "\x03\x06\v\x10\x17 )@"[block_part1 & 7];
  uVar4 = uVar16 & 0xff | uVar7;
  iVar14 = uVar4 - bVar1;
  local_43 = (undefined1)iVar14;
  if (iVar14 < 1) {
    local_43 = 0;
  }
  uVar5 = uVar10 & 0xff | uVar11;
  iVar14 = uVar5 - bVar1;
  local_42 = (undefined1)iVar14;
  if (iVar14 < 1) {
    local_42 = 0;
  }
  uVar12 = (uint)bVar1;
  local_41 = (undefined1)(uVar3 - uVar12);
  if ((int)(uVar3 - uVar12) < 1) {
    local_41 = 0;
  }
  local_4c[0] = (byte)((block_part1 >> 0x17) << 4) | (byte)(block_part1 >> 0x17) & 0xf;
  local_4c[1] = (byte)((block_part1 >> 0x13) << 4) | (byte)(block_part1 >> 0x13) & 0xf;
  local_4c[2] = (byte)((block_part1 >> 0xf) << 4) | (byte)(block_part1 >> 0xf) & 0xf;
  uVar4 = uVar4 + uVar12;
  local_4c[3] = (byte)uVar4;
  if (0xfe < uVar4) {
    local_4c[3] = 0xff;
  }
  uVar5 = uVar5 + uVar12;
  if (0xfe < uVar5) {
    uVar5 = 0xff;
  }
  uVar4 = uVar3 + uVar12;
  if (0xfe < uVar3 + uVar12) {
    uVar4 = 0xff;
  }
  local_4c[4] = (char)uVar5;
  local_4c[5] = (char)uVar4;
  local_46 = (byte)uVar16 | (byte)uVar7;
  local_45 = (byte)uVar10 | (byte)uVar11;
  local_44 = (char)uVar3;
  local_40 = starty * width + startx;
  local_3c = channelsRGB * local_40;
  iVar14 = 0;
  local_38 = 0;
  do {
    lVar8 = 0;
    iVar6 = local_40;
    iVar15 = local_3c;
    do {
      uVar3 = iVar14 + (int)lVar8;
      uVar3 = (uint)((block_part2 >> (uVar3 & 0x1f) & 1) != 0) +
              (block_part2 >> ((byte)uVar3 & 0x1f | 0x10) & 1) * 2;
      lVar2 = (ulong)uVar3 * 3;
      img[iVar15] = local_4c[lVar2];
      img[(long)iVar15 + 1] = local_4c[lVar2 + 1];
      iVar13 = iVar6 << (channelsRGB != 3) * '\x02';
      img[(long)iVar15 + 2] = local_4c[lVar2 + 2];
      if (uVar3 == 2) {
        puVar9[iVar13] = '\0';
        (img + iVar15)[0] = '\0';
        (img + iVar15)[1] = '\0';
        img[(long)iVar15 + 2] = '\0';
      }
      else {
        puVar9[iVar13] = 0xff;
      }
      lVar8 = lVar8 + 1;
      iVar15 = iVar15 + channelsRGB * width;
      iVar6 = iVar6 + width;
    } while (lVar8 != 4);
    local_38 = local_38 + 1;
    local_3c = local_3c + channelsRGB;
    local_40 = local_40 + 1;
    iVar14 = iVar14 + 4;
  } while (local_38 != 4);
  return;
}

Assistant:

void decompressBlockTHUMB59TAlphaC(unsigned int block_part1, unsigned int block_part2, uint8 *img, uint8* alpha, int width, int height, int startx, int starty, int channelsRGB)
{

	uint8 colorsRGB444[2][3];
	uint8 colors[2][3];
	uint8 paint_colors[4][3];
	uint8 distance;
	uint8 block_mask[4][4];
  int channelsA;

  if(channelsRGB == 3)
  {
    // We will decode the alpha data to a separate memory area. 
    channelsA = 1;
  }
  else
  {
    // We will decode the RGB data and the alpha data to the same memory area, 
    // interleaved as RGBA. 
    channelsA = 4;
    alpha = &img[0+3];
  }

	// First decode left part of block.
	colorsRGB444[0][R]= GETBITSHIGH(block_part1, 4, 58);
	colorsRGB444[0][G]= GETBITSHIGH(block_part1, 4, 54);
	colorsRGB444[0][B]= GETBITSHIGH(block_part1, 4, 50);

	colorsRGB444[1][R]= GETBITSHIGH(block_part1, 4, 46);
	colorsRGB444[1][G]= GETBITSHIGH(block_part1, 4, 42);
	colorsRGB444[1][B]= GETBITSHIGH(block_part1, 4, 38);

	distance   = GETBITSHIGH(block_part1, TABLE_BITS_59T, 34);

	// Extend the two colors to RGB888	
	decompressColor(R_BITS59T, G_BITS59T, B_BITS59T, colorsRGB444, colors);	
	calculatePaintColors59T(distance, PATTERN_T, colors, paint_colors);
	
	// Choose one of the four paint colors for each texel
	for (uint8 x = 0; x < BLOCKWIDTH; ++x) 
	{
		for (uint8 y = 0; y < BLOCKHEIGHT; ++y) 
		{
			//block_mask[x][y] = GETBITS(block_part2,2,31-(y*4+x)*2);
			block_mask[x][y] = GETBITS(block_part2,1,(y+x*4)+16)<<1;
			block_mask[x][y] |= GETBITS(block_part2,1,(y+x*4));
			img[channelsRGB*((starty+y)*width+startx+x)+R] = 
				CLAMP(0,paint_colors[block_mask[x][y]][R],255); // RED
			img[channelsRGB*((starty+y)*width+startx+x)+G] =
				CLAMP(0,paint_colors[block_mask[x][y]][G],255); // GREEN
			img[channelsRGB*((starty+y)*width+startx+x)+B] =
				CLAMP(0,paint_colors[block_mask[x][y]][B],255); // BLUE
			if(block_mask[x][y]==2)  
			{
				alpha[channelsA*(x+startx+(y+starty)*width)]=0;
				img[channelsRGB*((starty+y)*width+startx+x)+R] =0;
				img[channelsRGB*((starty+y)*width+startx+x)+G] =0;
				img[channelsRGB*((starty+y)*width+startx+x)+B] =0;
			}
			else
				alpha[channelsA*(x+startx+(y+starty)*width)]=255;
		}
	}
}